

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCache.cpp
# Opt level: O2

string * __thiscall
xmrig::OclCache::cacheKey_abi_cxx11_
          (string *__return_storage_ptr__,OclCache *this,char *deviceKey,char *options,char *source)

{
  allocator local_129;
  string in;
  uint8_t result [32];
  uint8_t hash [200];
  
  std::__cxx11::string::string((string *)&in,options,(allocator *)hash);
  std::__cxx11::string::append((char *)&in);
  std::__cxx11::string::append((char *)&in);
  keccak(in._M_dataplus._M_p,in._M_string_length,hash);
  result[0x10] = '\0';
  result[0x11] = '\0';
  result[0x12] = '\0';
  result[0x13] = '\0';
  result[0x14] = '\0';
  result[0x15] = '\0';
  result[0x16] = '\0';
  result[0x17] = '\0';
  result[0x18] = '\0';
  result[0x19] = '\0';
  result[0x1a] = '\0';
  result[0x1b] = '\0';
  result[0x1c] = '\0';
  result[0x1d] = '\0';
  result[0x1e] = '\0';
  result[0x1f] = '\0';
  result[0] = '\0';
  result[1] = '\0';
  result[2] = '\0';
  result[3] = '\0';
  result[4] = '\0';
  result[5] = '\0';
  result[6] = '\0';
  result[7] = '\0';
  result[8] = '\0';
  result[9] = '\0';
  result[10] = '\0';
  result[0xb] = '\0';
  result[0xc] = '\0';
  result[0xd] = '\0';
  result[0xe] = '\0';
  result[0xf] = '\0';
  base32_encode(hash,0xc,result,0x20);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)result,&local_129);
  std::__cxx11::string::~string((string *)&in);
  return __return_storage_ptr__;
}

Assistant:

std::string xmrig::OclCache::cacheKey(const char *deviceKey, const char *options, const char *source)
{
    std::string in(source);
    in += options;
    in += deviceKey;

    uint8_t hash[200];
    keccak(in.c_str(), in.size(), hash);

    uint8_t result[32] = { 0 };
    base32_encode(hash, 12, result, sizeof(result));

    return reinterpret_cast<char *>(result);
}